

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D.c
# Opt level: O2

int envy_bios_parse_bit_D(envy_bios *bios,envy_bios_bit_entry *bit)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_D_unk2_entry *peVar6;
  ulong uVar7;
  uint idx;
  
  (bios->D).bit = bit;
  idx = 0;
  do {
    iVar3 = parse_at(bios,idx,(char **)0x0);
    idx = idx + 1;
  } while (iVar3 == 0);
  uVar2 = (bios->D).unk2.offset;
  if (uVar2 != 0) {
    bios_u8(bios,(uint)uVar2,&(bios->D).unk2.version);
    if ((bios->D).unk2.version == ' ') {
      iVar3 = bios_u8(bios,(bios->D).unk2.offset + 1,&(bios->D).unk2.hlen);
      iVar4 = bios_u8(bios,(bios->D).unk2.offset + 2,&(bios->D).unk2.rlen);
      iVar5 = bios_u8(bios,(bios->D).unk2.offset + 3,&(bios->D).unk2.entriesnum);
      (bios->D).unk2.valid = iVar5 == 0 && (iVar4 == 0 && iVar3 == 0);
      bVar1 = (bios->D).unk2.entriesnum;
      peVar6 = (envy_bios_D_unk2_entry *)malloc((ulong)((uint)bVar1 * 2));
      (bios->D).unk2.entries = peVar6;
      for (uVar7 = 0; bVar1 != uVar7; uVar7 = uVar7 + 1) {
        peVar6[uVar7].offset =
             (short)uVar7 * (ushort)(bios->D).unk2.rlen +
             (ushort)(bios->D).unk2.hlen + (bios->D).unk2.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown UNK2 table version 0x%x\n");
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_D(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_D *d = &bios->D;
	unsigned int idx = 0;

	d->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_D_unk2(bios);

	return 0;
}